

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O0

void bignum_from_string(bn *n,char *str,int nbytes)

{
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int j;
  int i;
  uint32_t tmp;
  bn *in_stack_ffffffffffffffc8;
  int local_2c;
  int local_28;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    __assert_fail("n && \"\\\"n is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,100,"void bignum_from_string(struct bn *, char *, int)");
  }
  if (in_RSI == 0) {
    __assert_fail("str && \"\\\"str is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x65,"void bignum_from_string(struct bn *, char *, int)");
  }
  if ((int)in_EDX < 1) {
    __assert_fail("nbytes > 0 && \"\\\"nbytes must be positive\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x66,"void bignum_from_string(struct bn *, char *, int)");
  }
  if ((in_EDX & 1) != 0) {
    __assert_fail("(nbytes & 1) == 0 && \"\\\"string format must be in hex -> equal number of bytes\\\"\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x67,"void bignum_from_string(struct bn *, char *, int)");
  }
  bignum_init(in_stack_ffffffffffffffc8);
  local_2c = 0;
  for (local_28 = in_EDX - 8; -1 < local_28; local_28 = local_28 + -8) {
    local_c = 0;
    __isoc99_sscanf(in_RSI + local_28,"%8x",&local_c);
    *(undefined4 *)(in_RDI + (long)local_2c * 4) = local_c;
    local_2c = local_2c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void bignum_from_string(struct bn* n, char* str, int nbytes)
{
  require(n, "n is null");
  require(str, "str is null");
  require(nbytes > 0, "nbytes must be positive");
  require((nbytes & 1) == 0, "string format must be in hex -> equal number of bytes");
  require((nbytes % (sizeof(DTYPE) * 2)) == 0, "string length must be a multiple of (sizeof(DTYPE) * 2) characters");
  
  bignum_init(n);

  DTYPE tmp;                        /* DTYPE is defined in bn.h - uint{8,16,32,64}_t */
  int i = nbytes - (2 * WORD_SIZE); /* index into string */
  int j = 0;                        /* index into array */

  /* reading last hex-byte "MSB" from string first -> big endian */
  /* MSB ~= most significant byte / block ? :) */
  while (i >= 0)
  {
    tmp = 0;
    sscanf(&str[i], SSCANF_FORMAT_STR, &tmp);
    n->array[j] = tmp;
    i -= (2 * WORD_SIZE); /* step WORD_SIZE hex-byte(s) back in the string. */
    j += 1;               /* step one element forward in the array. */
  }
}